

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

LPBYTE CaptureContentKey(LPBYTE pbDataPtr,LPBYTE pbDataEnd,PCONTENT_KEY *PtrCKey)

{
  PCONTENT_KEY *PtrCKey_local;
  LPBYTE pbDataEnd_local;
  LPBYTE pbDataPtr_local;
  
  if (pbDataEnd < pbDataPtr + 0x10) {
    pbDataPtr_local = (LPBYTE)0x0;
  }
  else {
    *PtrCKey = (PCONTENT_KEY)pbDataPtr;
    pbDataPtr_local = pbDataPtr + 0x10;
  }
  return pbDataPtr_local;
}

Assistant:

LPBYTE CaptureContentKey(LPBYTE pbDataPtr, LPBYTE pbDataEnd, PCONTENT_KEY * PtrCKey)
{
    // Is there enough data?
    if((pbDataPtr + sizeof(CONTENT_KEY)) > pbDataEnd)
        return NULL;

    // Give data
    PtrCKey[0] = (PCONTENT_KEY)pbDataPtr;

    // Return the pointer to data following after the integer
    return pbDataPtr + sizeof(CONTENT_KEY);
}